

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

WriteBatch * __thiscall leveldb::DBImpl::BuildBatchGroup(DBImpl *this,Writer **last_writer)

{
  Writer *pWVar1;
  bool bVar2;
  reference ppWVar3;
  reference ppWVar4;
  size_t sVar5;
  long *in_RSI;
  _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
  *in_RDI;
  Writer *w;
  iterator iter;
  size_t max_size;
  size_t size;
  WriteBatch *result;
  Writer *first;
  _Self *in_stack_ffffffffffffff78;
  deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
  *in_stack_ffffffffffffff90;
  WriteBatch *in_stack_ffffffffffffff98;
  WriteBatch *in_stack_ffffffffffffffa0;
  _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
  local_50;
  ulong local_30;
  size_t local_28;
  WriteBatch *local_20;
  value_type local_18;
  long *local_10;
  
  local_10 = in_RSI;
  port::Mutex::AssertHeld((Mutex *)&in_RDI[0x46]._M_first);
  ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::front
                      (in_stack_ffffffffffffff90);
  local_18 = *ppWVar3;
  local_20 = local_18->batch;
  local_28 = WriteBatchInternal::ByteSize((WriteBatch *)0x113a22);
  local_30 = 0x100000;
  if (local_28 < 0x20001) {
    local_30 = local_28 + 0x20000;
  }
  *local_10 = (long)local_18;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::begin
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             in_stack_ffffffffffffff78);
  std::
  _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
  ::operator++(in_RDI);
  while( true ) {
    std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::end
              ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
               in_stack_ffffffffffffff78);
    bVar2 = std::operator!=(in_RDI,in_stack_ffffffffffffff78);
    if (!bVar2) {
      return local_20;
    }
    ppWVar4 = std::
              _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
              ::operator*(&local_50);
    pWVar1 = *ppWVar4;
    if (((pWVar1->sync & 1U) != 0) && ((local_18->sync & 1U) == 0)) break;
    if (pWVar1->batch != (WriteBatch *)0x0) {
      sVar5 = WriteBatchInternal::ByteSize((WriteBatch *)0x113aed);
      local_28 = sVar5 + local_28;
      if (local_30 < local_28) {
        return local_20;
      }
      if (local_20 == local_18->batch) {
        local_20 = (WriteBatch *)in_RDI[0x4d]._M_node;
        WriteBatchInternal::Append(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      WriteBatchInternal::Append(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    *local_10 = (long)pWVar1;
    std::
    _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
    ::operator++(in_RDI);
  }
  return local_20;
}

Assistant:

WriteBatch* DBImpl::BuildBatchGroup(Writer** last_writer) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  Writer* first = writers_.front();
  WriteBatch* result = first->batch;
  assert(result != nullptr);

  size_t size = WriteBatchInternal::ByteSize(first->batch);

  // Allow the group to grow up to a maximum size, but if the
  // original write is small, limit the growth so we do not slow
  // down the small write too much.
  size_t max_size = 1 << 20;
  if (size <= (128 << 10)) {
    max_size = size + (128 << 10);
  }

  *last_writer = first;
  std::deque<Writer*>::iterator iter = writers_.begin();
  ++iter;  // Advance past "first"
  for (; iter != writers_.end(); ++iter) {
    Writer* w = *iter;
    if (w->sync && !first->sync) {
      // Do not include a sync write into a batch handled by a non-sync write.
      break;
    }

    if (w->batch != nullptr) {
      size += WriteBatchInternal::ByteSize(w->batch);
      if (size > max_size) {
        // Do not make batch too big
        break;
      }

      // Append to *result
      if (result == first->batch) {
        // Switch to temporary batch instead of disturbing caller's batch
        result = tmp_batch_;
        assert(WriteBatchInternal::Count(result) == 0);
        WriteBatchInternal::Append(result, first->batch);
      }
      WriteBatchInternal::Append(result, w->batch);
    }
    *last_writer = w;
  }
  return result;
}